

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O2

void test_common<short>(uint length,short value)

{
  ulong uVar1;
  _func_int ***ppp_Var2;
  uint i;
  short *psVar3;
  undefined8 *puVar4;
  ulong uVar5;
  long lVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  int iVar8;
  short *local_50;
  shared_ptr<short> pa;
  shared_ptr<short> pb;
  
  uVar1 = (ulong)length;
  psVar3 = sse::common::malloc<short>(length + 1);
  std::__shared_ptr<short,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<short,void(*)(short*),void>
            ((__shared_ptr<short,(__gnu_cxx::_Lock_policy)2> *)&local_50,psVar3,
             sse::common::free<short>);
  psVar3 = sse::common::malloc<short>(length + 1);
  std::__shared_ptr<short,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<short,void(*)(short*),void>
            ((__shared_ptr<short,(__gnu_cxx::_Lock_policy)2> *)
             &pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount,psVar3,
             sse::common::free<short>);
  local_50[uVar1] = 0x7f;
  *(undefined2 *)
   ((long)&(pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + uVar1 * 2) = 0x3f;
  nosimd::common::set<short>(value,local_50,length);
  uVar5 = 0;
  while (uVar1 != uVar5) {
    psVar3 = local_50 + uVar5;
    uVar5 = uVar5 + 1;
    if (*psVar3 != value) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_common(unsigned int, T) [T = short]";
      *(undefined4 *)(puVar4 + 1) = 0x16;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  nosimd::common::copy<short>
            (local_50,(short *)pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                               _M_pi,length);
  uVar5 = 0;
  while (uVar1 != uVar5) {
    lVar6 = uVar5 * 2;
    uVar5 = uVar5 + 1;
    if (*(short *)((long)&(pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + lVar6) != value) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_common(unsigned int, T) [T = short]";
      *(undefined4 *)(puVar4 + 1) = 0x1d;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  sse::common::zero<short>
            ((short *)pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar5 = 0;
  while (uVar1 != uVar5) {
    lVar6 = uVar5 * 2;
    uVar5 = uVar5 + 1;
    if (*(short *)((long)&(pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + lVar6) != 0) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_common(unsigned int, T) [T = short]";
      *(undefined4 *)(puVar4 + 1) = 0x24;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
    local_50[uVar5] = (short)uVar5;
  }
  nosimd::common::copy<short>
            (local_50,(short *)pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                               _M_pi,length);
  lVar6 = 0;
  _Var7 = pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  while (uVar1 << 0x10 != lVar6) {
    ppp_Var2 = &(_Var7._M_pi)->_vptr__Sp_counted_base;
    iVar8 = (int)lVar6;
    lVar6 = lVar6 + 0x10000;
    _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&(_Var7._M_pi)->_vptr__Sp_counted_base + 2);
    if (iVar8 >> 0x10 != (int)*(short *)ppp_Var2) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_common(unsigned int, T) [T = short]";
      *(undefined4 *)(puVar4 + 1) = 0x2d;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
  }
  if ((local_50[uVar1] == 0x7f) &&
     (*(short *)((long)&(pa.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                        ->_vptr__Sp_counted_base + uVar1 * 2) == 0x3f)) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa);
    return;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar4 = "void test_common(unsigned int, T) [T = short]";
  *(undefined4 *)(puVar4 + 1) = 0x31;
  *(uint *)((long)puVar4 + 0xc) = length;
  __cxa_throw(puVar4,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}